

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::releaseExport
          (RpcConnectionState *this,ExportId id,uint refcount)

{
  Export *pEVar1;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Export_&> MVar2;
  uint uVar3;
  Fault f;
  ExportId local_6c;
  Export local_68;
  Export local_40;
  
  MVar2 = ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Export>::
          find(&this->exports,id);
  if (MVar2.ptr == (Export *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xa65,FAILED,(char *)0x0,"\"Tried to release invalid export ID.\"",
               (char (*) [36])"Tried to release invalid export ID.");
  }
  else {
    uVar3 = (MVar2.ptr)->refcount - refcount;
    if (refcount <= (MVar2.ptr)->refcount) {
      (MVar2.ptr)->refcount = uVar3;
      if (uVar3 != 0) {
        return;
      }
      local_68._0_8_ = ((MVar2.ptr)->clientHook).ptr;
      std::
      _Hashtable<capnp::ClientHook_*,_std::pair<capnp::ClientHook_*const,_unsigned_int>,_std::allocator<std::pair<capnp::ClientHook_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::ClientHook_*>,_std::hash<capnp::ClientHook_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->exportsByCap)._M_h,&local_68);
      pEVar1 = (this->exports).slots.builder.ptr;
      local_40.refcount = pEVar1[id].refcount;
      local_40.clientHook.disposer = pEVar1[id].clientHook.disposer;
      local_40.clientHook.ptr = pEVar1[id].clientHook.ptr;
      pEVar1[id].clientHook.ptr = (ClientHook *)0x0;
      local_40.resolveOp.super_PromiseBase.node.disposer =
           pEVar1[id].resolveOp.super_PromiseBase.node.disposer;
      local_40.resolveOp.super_PromiseBase.node.ptr =
           pEVar1[id].resolveOp.super_PromiseBase.node.ptr;
      pEVar1[id].resolveOp.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      local_68.clientHook.ptr = (ClientHook *)0x0;
      local_68.resolveOp.super_PromiseBase.node.disposer = (Disposer *)0x0;
      local_68._0_8_ = (Exception *)0x0;
      local_68.clientHook.disposer = (Disposer *)0x0;
      local_68.resolveOp.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      local_6c = id;
      Export::operator=(pEVar1 + id,&local_68);
      Export::~Export(&local_68);
      std::
      priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
      ::push(&(this->exports).freeIds,&local_6c);
      Export::~Export(&local_40);
      return;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xa5b,FAILED,"refcount <= exp->refcount",
               "\"Tried to drop export\'s refcount below zero.\"",
               (char (*) [44])"Tried to drop export\'s refcount below zero.");
  }
  kj::_::Debug::Fault::~Fault((Fault *)&local_68);
  return;
}

Assistant:

void releaseExport(ExportId id, uint refcount) {
    KJ_IF_MAYBE(exp, exports.find(id)) {
      KJ_REQUIRE(refcount <= exp->refcount, "Tried to drop export's refcount below zero.") {
        return;
      }

      exp->refcount -= refcount;
      if (exp->refcount == 0) {
        exportsByCap.erase(exp->clientHook);
        exports.erase(id, *exp);
      }
    } else {
      KJ_FAIL_REQUIRE("Tried to release invalid export ID.") {
        return;
      }